

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O1

void af_glyph_hints_done(AF_GlyphHints hints)

{
  FT_Memory memory;
  long lVar1;
  AF_EdgeRec *pAVar2;
  
  if ((hints != (AF_GlyphHints)0x0) && (memory = hints->memory, memory != (FT_Memory)0x0)) {
    pAVar2 = hints->axis[0].embedded.edges;
    lVar1 = 1;
    do {
      *(undefined8 *)((long)(pAVar2 + -0x11) + 0x10) = 0;
      if ((void *)((long)(pAVar2 + -0x11) + 0x38) != *(void **)((long)(pAVar2 + -0x11) + 0x18)) {
        ft_mem_free(memory,*(void **)((long)(pAVar2 + -0x11) + 0x18));
        *(undefined8 *)((long)(pAVar2 + -0x11) + 0x18) = 0;
      }
      *(undefined8 *)((long)(pAVar2 + -0x11) + 0x20) = 0;
      if (pAVar2 != (AF_EdgeRec *)*(undefined1 **)((long)(pAVar2 + -0x11) + 0x28)) {
        ft_mem_free(memory,*(undefined1 **)((long)(pAVar2 + -0x11) + 0x28));
        *(undefined8 *)((long)(pAVar2 + -0x11) + 0x28) = 0;
      }
      pAVar2 = (AF_EdgeRec *)((long)(pAVar2 + 0x1c) + 0x48);
      lVar1 = lVar1 + -1;
    } while (lVar1 == 0);
    if ((anon_struct_7744_2_b586ae8f_for_embedded *)hints->contours != &hints->embedded) {
      ft_mem_free(memory,hints->contours);
      hints->contours = (AF_Point_conflict *)0x0;
    }
    hints->max_contours = 0;
    hints->num_contours = 0;
    if (hints->points != (hints->embedded).points) {
      ft_mem_free(memory,hints->points);
      hints->points = (AF_Point_conflict)0x0;
    }
    hints->max_points = 0;
    hints->num_points = 0;
    hints->memory = (FT_Memory)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_done( AF_GlyphHints  hints )
  {
    FT_Memory  memory;
    int        dim;


    if ( !( hints && hints->memory ) )
      return;

    memory = hints->memory;

    /*
     * note that we don't need to free the segment and edge
     * buffers since they are really within the hints->points array
     */
    for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
    {
      AF_AxisHints  axis = &hints->axis[dim];


      axis->num_segments = 0;
      axis->max_segments = 0;
      if ( axis->segments != axis->embedded.segments )
        FT_FREE( axis->segments );

      axis->num_edges = 0;
      axis->max_edges = 0;
      if ( axis->edges != axis->embedded.edges )
        FT_FREE( axis->edges );
    }

    if ( hints->contours != hints->embedded.contours )
      FT_FREE( hints->contours );
    hints->max_contours = 0;
    hints->num_contours = 0;

    if ( hints->points != hints->embedded.points )
      FT_FREE( hints->points );
    hints->max_points = 0;
    hints->num_points = 0;

    hints->memory = NULL;
  }